

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmakecl.cpp
# Opt level: O0

void __thiscall
CTcLibParserCmdline::scan_full_source(CTcLibParserCmdline *this,char *val,char *fname)

{
  CTcMakeModule *this_00;
  undefined8 in_RSI;
  char *in_RDI;
  CTcMakeModule *mod;
  char url [8212];
  char *in_stack_ffffffffffffdfc0;
  textchar_t *in_stack_ffffffffffffdfc8;
  CTcMake *in_stack_ffffffffffffdfd0;
  
  this_00 = CTcMake::add_module(in_stack_ffffffffffffdfd0,in_stack_ffffffffffffdfc8,
                                in_stack_ffffffffffffdfc0,in_RDI);
  sprintf(&stack0xffffffffffffdfc8,"%.*s%.*s",0x1000,*(undefined8 *)(in_RDI + 0x48),0x1000,in_RSI);
  CTcMakeModule::set_url(this_00,in_RDI);
  CTcMakeModule::set_orig_name(this_00,in_RDI);
  CTcMakeModule::set_from_lib
            ((CTcMakeModule *)in_stack_ffffffffffffdfd0,in_stack_ffffffffffffdfc8,
             (textchar_t *)this_00);
  return;
}

Assistant:

void scan_full_source(const char *val, const char *fname)
    {
        char url[OSFNMAX*2 + 20];
        CTcMakeModule *mod;
        
        /* add the source module to our module list */
        mod = mk_->add_module(fname, 0, 0);

        /* 
         *   build the full URL for the module - this is the library URL
         *   prefix plus the "source:" value (not the full filename - simply
         *   the original unretouched value of the "source:" variable) 
         */
        sprintf(url, "%.*s%.*s", (int)OSFNMAX, lib_url_, (int)OSFNMAX, val);

        /* set the module's URL */
        mod->set_url(url);

        /* set the module's original name and library name */
        mod->set_orig_name(val);
        mod->set_from_lib(lib_name_, lib_url_);
    }